

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

void add_opvars(sp_lev *sp,char *fmt,...)

{
  char in_AL;
  opvar *poVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_298;
  undefined8 *local_280;
  undefined8 *local_258;
  long *local_230;
  long *local_208;
  long *local_1e0;
  long *local_1b8;
  long *local_190;
  long *local_168;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  long local_80;
  long i;
  opvar *ov_7;
  opvar *ov_6;
  opvar *ov_5;
  opvar *ov_4;
  opvar *ov_3;
  opvar *ov_2;
  opvar *ov_1;
  opvar *ov;
  va_list argp;
  char *p;
  char *fmt_local;
  sp_lev *sp_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  argp[0].overflow_arg_area = local_138;
  argp[0]._0_8_ = &stack0x00000008;
  ov._4_4_ = 0x30;
  ov._0_4_ = 0x10;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  for (argp[0].reg_save_area = fmt; *argp[0].reg_save_area != '\0';
      argp[0].reg_save_area = (void *)((long)argp[0].reg_save_area + 1)) {
    switch(*argp[0].reg_save_area) {
    case 0x20:
      break;
    default:
      fprintf(_stderr,"add_opvars: illegal format character \'%c\'.\n",
              (ulong)(uint)(int)*argp[0].reg_save_area);
      break;
    case 0x4d:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_208 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_208 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_5 = poVar1;
      set_opvar_monst(poVar1,*local_208);
      add_opcode(sp,0x28,ov_5);
      break;
    case 0x4f:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_230 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_230 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_6 = poVar1;
      set_opvar_obj(poVar1,*local_230);
      add_opcode(sp,0x28,ov_6);
      break;
    case 99:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_190 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_190 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_2 = poVar1;
      set_opvar_coord(poVar1,*local_190);
      add_opcode(sp,0x28,ov_2);
      break;
    case 0x69:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_168 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_168 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_1 = poVar1;
      set_opvar_int(poVar1,*local_168);
      add_opcode(sp,0x28,ov_1);
      break;
    case 0x6d:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_1e0 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_1e0 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_4 = poVar1;
      set_opvar_mapchar(poVar1,*local_1e0);
      add_opcode(sp,0x28,ov_4);
      break;
    case 0x6f:
      if ((uint)ov < 0x29) {
        local_298 = (int *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_298 = (int *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      local_80 = (long)*local_298;
      if ((local_80 < 0) || (0x4b < local_80)) {
        fprintf(_stderr,"add_opvars: unknown opcode \'%li\'.\n",local_80);
      }
      add_opcode(sp,(int)local_80,(void *)0x0);
      break;
    case 0x72:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_1b8 = (long *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_1b8 = (long *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_3 = poVar1;
      set_opvar_region(poVar1,*local_1b8);
      add_opcode(sp,0x28,ov_3);
      break;
    case 0x73:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_258 = (undefined8 *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_258 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      ov_7 = poVar1;
      set_opvar_str(poVar1,(char *)*local_258);
      add_opcode(sp,0x28,ov_7);
      break;
    case 0x76:
      poVar1 = (opvar *)malloc(0x10);
      memset(poVar1,0,0x10);
      if ((uint)ov < 0x29) {
        local_280 = (undefined8 *)((long)(int)(uint)ov + (long)argp[0].overflow_arg_area);
        ov._0_4_ = (uint)ov + 8;
      }
      else {
        local_280 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      i = (long)poVar1;
      set_opvar_var(poVar1,(char *)*local_280);
      add_opcode(sp,0x28,(void *)i);
    }
  }
  return;
}

Assistant:

void add_opvars(sp_lev *sp, const char *fmt, ...)
{
	const char *p;
	va_list argp;

	va_start(argp, fmt);

	for (p = fmt; *p != '\0'; p++) {
	    switch(*p) {
	    case ' ': break;
	    case 'i':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_int(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'c':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_coord(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'r':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_region(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'm':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_mapchar(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'M':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_monst(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'O':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_obj(ov, va_arg(argp, long));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 's':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_str(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'v':
		{
		    struct opvar *ov = New(struct opvar);
		    set_opvar_var(ov, va_arg(argp, char *));
		    add_opcode(sp, SPO_PUSH, ov);
		    break;
		}
	    case 'o':
		{
		    long i = va_arg(argp, int);
		    if (i < 0 || i >= MAX_SP_OPCODES)
			fprintf(stderr, "add_opvars: unknown opcode '%li'.\n", i);
		    add_opcode(sp, i, NULL);
		    break;
		}
	    default:
		fprintf(stderr, "add_opvars: illegal format character '%c'.\n", *p);
		break;
	    }
	}

	va_end(argp);
}